

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O2

void __thiscall cornerstone::buffer::put(buffer *this,byte b)

{
  uint uVar1;
  uint uVar2;
  overflow_error *this_00;
  uint uVar3;
  
  uVar1 = *(uint *)this;
  uVar3 = 0x7fffffff;
  if (-1 < (int)uVar1) {
    uVar3 = 0xffff;
  }
  if ((int)uVar1 < 0) {
    uVar2 = *(uint *)(this + 4);
    if ((uVar3 & uVar1) == uVar2) goto LAB_00139b9c;
    this[(ulong)uVar2 + 8] = (buffer)b;
    *(uint *)(this + 4) = uVar2 + 1;
  }
  else {
    if ((uVar3 & uVar1) == uVar1 >> 0x10) {
LAB_00139b9c:
      this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
      std::overflow_error::overflow_error(this_00,"insufficient buffer to store byte");
      __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
    }
    this[(ulong)(uVar1 >> 0x10) + 4] = (buffer)b;
    *(short *)(this + 2) = (short)(uVar1 >> 0x10) + 1;
  }
  return;
}

Assistant:

size_t buffer::size() const
{
    return (size_t)(__size_of_block(this));
}